

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O3

_Bool Curl_pipeline_server_blacklisted(SessionHandle *handle,char *server_name)

{
  char *__s;
  int iVar1;
  curl_llist *pcVar2;
  size_t max;
  curl_llist_element *pcVar3;
  char *fmt;
  _Bool _Var4;
  
  if (handle->multi == (Curl_multi *)0x0) {
    _Var4 = false;
  }
  else {
    pcVar2 = Curl_multi_pipelining_server_bl(handle->multi);
    fmt = "Server %s is not blacklisted\n";
    if ((pcVar2 == (curl_llist *)0x0) ||
       (pcVar3 = pcVar2->head, pcVar3 == (curl_llist_element *)0x0)) {
      _Var4 = false;
    }
    else {
      do {
        __s = (char *)pcVar3->ptr;
        max = strlen(__s);
        iVar1 = Curl_raw_nequal(__s,server_name,max);
        _Var4 = iVar1 != 0;
        if (_Var4) {
          fmt = "Server %s is blacklisted\n";
          break;
        }
        pcVar3 = pcVar3->next;
      } while (pcVar3 != (curl_llist_element *)0x0);
    }
    Curl_infof(handle,fmt,server_name);
  }
  return _Var4;
}

Assistant:

bool Curl_pipeline_server_blacklisted(struct SessionHandle *handle,
                                      char *server_name)
{
  if(handle->multi) {
    struct curl_llist *blacklist =
      Curl_multi_pipelining_server_bl(handle->multi);

    if(blacklist) {
      struct curl_llist_element *curr;

      curr = blacklist->head;
      while(curr) {
        char *bl_server_name;

        bl_server_name = curr->ptr;
        if(Curl_raw_nequal(bl_server_name, server_name,
                           strlen(bl_server_name))) {
          infof(handle, "Server %s is blacklisted\n", server_name);
          return TRUE;
        }
        curr = curr->next;
      }
    }

    infof(handle, "Server %s is not blacklisted\n", server_name);
  }
  return FALSE;
}